

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O0

_Bool hostcompare(char *host,char *check)

{
  int iVar1;
  size_t sVar2;
  size_t clen;
  size_t hlen;
  char *check_local;
  char *host_local;
  
  clen = strlen(host);
  sVar2 = strlen(check);
  if ((clen != 0) && (host[clen - 1] == '.')) {
    clen = clen - 1;
  }
  if (clen == sVar2) {
    iVar1 = curl_strnequal(host,check,clen);
    host_local._7_1_ = iVar1 != 0;
  }
  else {
    host_local._7_1_ = false;
  }
  return host_local._7_1_;
}

Assistant:

static bool hostcompare(const char *host, const char *check)
{
  size_t hlen = strlen(host);
  size_t clen = strlen(check);

  if(hlen && (host[hlen - 1] == '.'))
    hlen--;
  if(hlen != clen)
    /* they cannot match if they have different lengths */
    return FALSE;
  return strncasecompare(host, check, hlen);
}